

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O3

void ShowExampleMenuFile(void)

{
  bool bVar1;
  ImU32 col;
  char *label;
  ImDrawList *this;
  int idx;
  int i;
  uint uVar2;
  ImVec2 p;
  ImVec2 local_68;
  ImVec2 local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  
  ImGui::MenuItem("(demo menu)",(char *)0x0,false,false);
  ImGui::MenuItem("New",(char *)0x0,false,true);
  ImGui::MenuItem("Open","Ctrl+O",false,true);
  bVar1 = ImGui::BeginMenu("Open Recent",true);
  if (bVar1) {
    ImGui::MenuItem("fish_hat.c",(char *)0x0,false,true);
    ImGui::MenuItem("fish_hat.inl",(char *)0x0,false,true);
    ImGui::MenuItem("fish_hat.h",(char *)0x0,false,true);
    bVar1 = ImGui::BeginMenu("More..",true);
    if (bVar1) {
      ImGui::MenuItem("Hello",(char *)0x0,false,true);
      ImGui::MenuItem("Sailor",(char *)0x0,false,true);
      bVar1 = ImGui::BeginMenu("Recurse..",true);
      if (bVar1) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::EndMenu();
    }
    ImGui::EndMenu();
  }
  ImGui::MenuItem("Save","Ctrl+S",false,true);
  ImGui::MenuItem("Save As..",(char *)0x0,false,true);
  ImGui::Separator();
  bVar1 = ImGui::BeginMenu("Options",true);
  if (bVar1) {
    ImGui::MenuItem("Enabled","",&ShowExampleMenuFile::enabled,true);
    local_60.x = 0.0;
    local_60.y = 60.0;
    ImGui::BeginChild("child",&local_60,true,0);
    uVar2 = 0;
    do {
      ImGui::Text("Scrolling Text %d",(ulong)uVar2);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 10);
    ImGui::EndChild();
    ImGui::SliderFloat("Value",&ShowExampleMenuFile::f,0.0,1.0,"%.3f",0);
    ImGui::InputFloat("Input",&ShowExampleMenuFile::f,0.1,0.0,"%.3f",0);
    ImGui::Combo("Combo",&ShowExampleMenuFile::n,"Yes",-1);
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu("Colors",true);
  if (bVar1) {
    local_58 = ImGui::GetTextLineHeight();
    idx = 0;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    local_48 = local_58;
    do {
      label = ImGui::GetStyleColorName(idx);
      local_60 = ImGui::GetCursorScreenPos();
      this = ImGui::GetWindowDrawList();
      local_68.y = local_60.y + fStack_54;
      local_68.x = local_60.x + local_58;
      col = ImGui::GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled(this,&local_60,&local_68,col,0.0,0xf);
      local_68.y = local_48;
      local_68.x = local_48;
      ImGui::Dummy(&local_68);
      ImGui::SameLine(0.0,-1.0);
      ImGui::MenuItem(label,(char *)0x0,false,true);
      idx = idx + 1;
    } while (idx != 0x35);
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu("Options",true);
  if (bVar1) {
    ImGui::Checkbox("SomeOption",&ShowExampleMenuFile::b);
    ImGui::EndMenu();
  }
  ImGui::BeginMenu("Disabled",false);
  ImGui::MenuItem("Checked",(char *)0x0,true,true);
  ImGui::MenuItem("Quit","Alt+F4",false,true);
  return;
}

Assistant:

static void ShowExampleMenuFile()
{
    ImGui::MenuItem("(dummy menu)", NULL, false, false);
    if (ImGui::MenuItem("New")) {}
    if (ImGui::MenuItem("Open", "Ctrl+O")) {}
    if (ImGui::BeginMenu("Open Recent"))
    {
        ImGui::MenuItem("fish_hat.c");
        ImGui::MenuItem("fish_hat.inl");
        ImGui::MenuItem("fish_hat.h");
        if (ImGui::BeginMenu("More.."))
        {
            ImGui::MenuItem("Hello");
            ImGui::MenuItem("Sailor");
            if (ImGui::BeginMenu("Recurse.."))
            {
                ShowExampleMenuFile();
                ImGui::EndMenu();
            }
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Save", "Ctrl+S")) {}
    if (ImGui::MenuItem("Save As..")) {}
    ImGui::Separator();
    if (ImGui::BeginMenu("Options"))
    {
        static bool enabled = true;
        ImGui::MenuItem("Enabled", "", &enabled);
        ImGui::BeginChild("child", ImVec2(0, 8), true);
        for (int i = 0; i < 10; i++)
            ImGui::Text("Scrolling Text %d", i);
        ImGui::EndChild();
        static float f = 0.5f;
        static int n = 0;
        static bool b = true;
        ImGui::SliderFloat("Value", &f, 0.0f, 1.0f);
        ImGui::InputFloat("Input", &f, 0.1f);
        ImGui::Combo("Combo", &n, "Yes\0No\0Maybe\0\0");
        ImGui::Checkbox("Check", &b);
        ImGui::EndMenu();
    }
    if (ImGui::BeginMenu("Colors"))
    {
        float sz = ImGui::GetTextLineHeight();
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName((ImGuiCol)i);
            ImVec2 p = ImGui::GetCursorScreenPos();
            ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x+sz, p.y+sz), ImGui::GetColorU32((ImGuiCol)i));
            ImGui::Dummy(ImVec2(sz, sz));
            ImGui::SameLine();
            ImGui::MenuItem(name);
        }
        ImGui::EndMenu();
    }
    if (ImGui::BeginMenu("Disabled", false)) // Disabled
    {
        IM_ASSERT(0);
    }
    if (ImGui::MenuItem("Checked", NULL, true)) {}
    if (ImGui::MenuItem("Quit", "Alt+F4")) {}
}